

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int JetHead::Socket::getInterfaceAddress(char *if_name,Address *addr)

{
  int __fd;
  int res;
  int sockfd;
  ifreq ifr;
  Address *addr_local;
  char *if_name_local;
  
  ifr.ifr_ifru._16_8_ = addr;
  __fd = socket(2,2,0);
  if (__fd < 0) {
    jh_log_print(1,
                 "static int JetHead::Socket::getInterfaceAddress(const char *, Socket::Address &)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,0x24e,"socket failed");
    if_name_local._4_4_ = -1;
  }
  else {
    strncpy((char *)&res,if_name,0x10);
    ifr.ifr_ifrn.ifrn_name[7] = '\0';
    ifr.ifr_ifrn._8_2_ = 2;
    if_name_local._4_4_ = ioctl(__fd,0x8915,&res);
    if (if_name_local._4_4_ == 0) {
      Address::setSockaddr
                ((Address *)ifr.ifr_ifru._16_8_,(sockaddr_in *)((long)&ifr.ifr_ifrn + 8),0x10);
      ::close(__fd);
    }
    else {
      jh_log_print(2,
                   "static int JetHead::Socket::getInterfaceAddress(const char *, Socket::Address &)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                   ,0x25b,"SIOCGIFADDR failed for %s",&res);
      ::close(__fd);
    }
  }
  return if_name_local._4_4_;
}

Assistant:

int Socket::getInterfaceAddress( const char *if_name, Socket::Address& addr )
{
	struct ifreq ifr;
	int sockfd;

	sockfd = socket( PF_INET, SOCK_DGRAM, 0 );

	if ( sockfd < 0 )
	{
		LOG_ERR_FATAL( "socket failed" );
		return -1;
	}
	
	strncpy(ifr.ifr_name, if_name, IFNAMSIZ);
	ifr.ifr_name[IFNAMSIZ - 1] = 0;

	ifr.ifr_addr.sa_family = AF_INET;

	int res = ioctl(sockfd, SIOCGIFADDR, &ifr); 	

	if (res)
	{	
		LOG_WARN( "SIOCGIFADDR failed for %s", ifr.ifr_name );
		
		::close( sockfd );
		
		return res;
	}

	addr.setSockaddr( (struct sockaddr_in*) &(ifr.ifr_addr), 
					  sizeof(struct sockaddr_in) );
	
	LOG_INFO( "Lookup of %s got address %s", if_name, addr.getName() );
	
	::close( sockfd );
	
	return res;
}